

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestFileVsMessageScope_Test::
GeneratedMessageTest_TestFileVsMessageScope_Test
          (GeneratedMessageTest_TestFileVsMessageScope_Test *this)

{
  GeneratedMessageTest_TestFileVsMessageScope_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageTest_TestFileVsMessageScope_Test_02a056c0;
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestFileVsMessageScope) {
  // Special names at message scope are mangled,
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::unknown_fields_);
  // But not at file scope.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::unknown_fields);
}